

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unidim-lipm-dcm-estimator.cpp
# Opt level: O3

void __thiscall
stateObservation::UnidimLipmDcmEstimator::setUnbiasedDCM
          (UnidimLipmDcmEstimator *this,double dcm,double uncertainty)

{
  DenseStorage<double,__1,__1,__1,_0> local_58;
  double local_38;
  double dStack_30;
  double local_28;
  
  local_28 = uncertainty;
  setUnbiasedDCM(this,dcm);
  KalmanFilterBase::getStateCovariance((Pmatrix *)&local_58,&(this->filter_).super_KalmanFilterBase)
  ;
  if ((local_58.m_rows != 2) || (local_58.m_cols != 2)) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, 2, 2>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 2, 2>]"
                 );
  }
  dStack_30 = local_58.m_data[3];
  local_38 = 0.0;
  free(local_58.m_data);
  local_58.m_data = (double *)0x0;
  local_58.m_rows = 0;
  local_58.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_58,4,2,2);
  if ((local_58.m_rows != 2) || (local_58.m_cols != 2)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_58,4,2,2);
    if ((local_58.m_rows != 2) || (local_58.m_cols != 2)) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, 2, 2>, T1 = double, T2 = double]"
                   );
    }
  }
  *local_58.m_data = local_28 * local_28;
  local_58.m_data[1] = 0.0;
  local_58.m_data[2] = local_38;
  local_58.m_data[3] = dStack_30;
  KalmanFilterBase::setStateCovariance(&(this->filter_).super_KalmanFilterBase,(Pmatrix *)&local_58)
  ;
  free(local_58.m_data);
  return;
}

Assistant:

void UnidimLipmDcmEstimator::setUnbiasedDCM(double dcm, double uncertainty)
{
  setUnbiasedDCM(dcm);
  Matrix2 P = filter_.getStateCovariance();
  /// resetting the non diagonal parts
  P(0, 1) = P(1, 0) = 0;
  P(0, 0) = square(uncertainty);
  filter_.setStateCovariance(P);
}